

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rco.cpp
# Opt level: O0

RCOError __thiscall RCO::getStringTableString(RCO *this,string *s,uint32_t offset,uint32_t len)

{
  char *__s;
  char *buf;
  uint32_t len_local;
  uint32_t offset_local;
  string *s_local;
  RCO *this_local;
  
  __s = (char *)operator_new__((ulong)(len + 1));
  memset(__s,0,(ulong)(len + 1));
  memcpy(__s,this->mBuffer + (ulong)offset + (ulong)(this->mHeader).strings_start_off,(ulong)len);
  std::__cxx11::string::operator=((string *)s,__s);
  return NO_ERROR;
}

Assistant:

RCOError RCO::getStringTableString(std::string& s, uint32_t offset, uint32_t len)
{
	char *buf = new char[len + 1];
	memset(buf, 0, len + 1);
	memcpy(buf, mBuffer + mHeader.strings_start_off + offset, sizeof(char) * len);

	s = buf;
	return NO_ERROR;
}